

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O3

double __thiscall
HyperGraph::effic_inf_valid_algo(HyperGraph *this,Nodelist *vecSeed,double delta,double eps)

{
  ulong *puVar1;
  uint uVar2;
  uint *puVar3;
  pointer pvVar4;
  _Bit_type *p_Var5;
  pointer puVar6;
  byte bVar7;
  uint *puVar8;
  pointer ppVar9;
  ulong uVar10;
  pointer ppVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  HyperGraph *pHVar15;
  uint uVar16;
  ulong uVar17;
  Nodelist *__range1;
  long lVar18;
  long lVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar23;
  undefined1 auVar22 [16];
  double dVar24;
  allocator_type local_aa;
  bool local_a9;
  long local_a8;
  long local_a0;
  HyperGraph *local_98;
  double dStack_90;
  _Bit_type *local_80;
  undefined1 local_78 [16];
  double local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_78._8_8_ = local_78._0_8_;
  local_78._0_8_ = eps;
  local_98 = (HyperGraph *)((eps + 1.0) * 2.8731273138361804);
  dVar20 = log(2.0 / delta);
  local_60 = (dVar20 * (double)local_98) / ((double)local_78._0_8_ * (double)local_78._0_8_) + 1.0;
  local_a9 = false;
  local_98 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)this->__numV,&local_a9,&local_aa);
  puVar3 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar8 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[*puVar8 >> 6] =
         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[*puVar8 >> 6] | 1L << ((byte)*puVar8 & 0x3f);
  }
  dVar24 = 0.0;
  dStack_90 = 0.0;
  dVar20 = 0.0;
  dVar23 = 0.0;
  pHVar15 = local_98;
  if (0.0 < local_60) {
    lVar18 = 0;
    lVar19 = 0;
    local_80 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
    do {
      uVar2 = pHVar15->__numV;
      if (0x17d < dsfmt_global_data.idx) {
        dsfmt_gen_rand_all(&dsfmt_global_data);
        dsfmt_global_data.idx = 0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = local_80;
        pHVar15 = local_98;
      }
      uVar17 = (ulong)*(uint *)((long)dsfmt_global_data.status + (long)dsfmt_global_data.idx * 8) %
               (ulong)uVar2;
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
        dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
        *(pHVar15->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start = (uint)uVar17;
        puVar1 = (pHVar15->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar17 >> 6);
        *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
        uVar17 = 1;
        uVar13 = 0;
        local_a8 = lVar19;
        local_a0 = lVar18;
        do {
          uVar2 = (pHVar15->__vecVisitNode).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13];
          local_78._0_8_ = uVar13;
          if (pHVar15->_cascadeModel == LT) {
            pvVar4 = (pHVar15->_graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            ppVar9 = pvVar4[uVar2].
                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar11 = *(pointer *)
                       ((long)&pvVar4[uVar2].
                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               ._M_impl.super__Vector_impl_data + 8);
            if (ppVar11 != ppVar9) {
              if (0x17d < dsfmt_global_data.idx) {
                dsfmt_gen_rand_all(&dsfmt_global_data);
                ppVar9 = pvVar4[uVar2].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar11 = *(pointer *)
                           ((long)&pvVar4[uVar2].
                                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                   ._M_impl.super__Vector_impl_data + 8);
                dsfmt_global_data.idx = 0;
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p = local_80;
                pHVar15 = local_98;
              }
              iVar14 = dsfmt_global_data.idx + 1;
              dVar20 = 2.0 - dsfmt_global_data.status[0].d[dsfmt_global_data.idx];
              if ((double)ppVar9->second <= dVar20) {
                lVar18 = (long)ppVar11 - (long)ppVar9 >> 3;
                if (dVar20 <= (double)ppVar11[-1].second) {
                  uVar13 = lVar18 - 1;
                  if (uVar13 == 0) goto LAB_00117750;
                  uVar12 = 0;
                  do {
                    uVar10 = uVar13 + uVar12 >> 1;
                    if ((double)ppVar9[uVar10].second < dVar20) {
                      uVar12 = uVar10 + 1;
                      uVar10 = uVar13;
                    }
                    uVar13 = uVar10;
                  } while (uVar12 < uVar10);
                }
                else {
                  uVar10 = lVar18 + 1;
                }
              }
              else {
LAB_00117750:
                uVar10 = 0;
              }
              pvVar4 = (pHVar15->_graph->
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar18 = *(long *)&pvVar4[uVar2].
                                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar19 = local_a8;
              dsfmt_global_data.idx = iVar14;
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar4[uVar2].
                                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar18 >> 3) <=
                  uVar10) goto LAB_00117835;
              uVar2 = *(uint *)(lVar18 + uVar10 * 8);
              p_Var5 = (pHVar15->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar12 = 1L << ((byte)uVar2 & 0x3f);
              uVar16 = uVar2 >> 6;
              uVar13 = p_Var5[uVar16];
              if ((uVar13 >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00117835;
              if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16] & uVar12)
                  != 0) {
                lVar19 = local_a8 + 1;
                goto LAB_00117835;
              }
              (pHVar15->__vecVisitNode).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] = uVar2;
              uVar17 = uVar17 + 1;
              p_Var5[uVar16] = uVar12 | uVar13;
            }
          }
          else if (pHVar15->_cascadeModel == IC) {
            pvVar4 = (pHVar15->_graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            ppVar11 = *(pointer *)
                       ((long)&pvVar4[uVar2].
                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               ._M_impl.super__Vector_impl_data + 8);
            for (ppVar9 = pvVar4[uVar2].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar11;
                ppVar9 = ppVar9 + 1) {
              uVar2 = ppVar9->first;
              uVar13 = 1L << ((byte)uVar2 & 0x3f);
              uVar16 = uVar2 >> 6;
              if (((pHVar15->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16] >>
                   ((ulong)uVar2 & 0x3f) & 1) == 0) {
                if (0x17d < dsfmt_global_data.idx) {
                  dsfmt_gen_rand_all(&dsfmt_global_data);
                  dsfmt_global_data.idx = 0;
                  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = local_80;
                  pHVar15 = local_98;
                }
                iVar14 = dsfmt_global_data.idx + 1;
                lVar18 = (long)dsfmt_global_data.idx;
                dsfmt_global_data.idx = iVar14;
                if (2.0 - dsfmt_global_data.status[0].d[lVar18] <= (double)ppVar9->second) {
                  if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16] &
                      uVar13) != 0) {
                    lVar19 = local_a8 + 1;
                    goto LAB_00117810;
                  }
                  (pHVar15->__vecVisitNode).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17] = uVar2;
                  uVar17 = uVar17 + 1;
                  puVar1 = (pHVar15->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           uVar16;
                  *puVar1 = *puVar1 | uVar13;
                }
              }
            }
          }
          uVar13 = local_78._0_8_ + 1;
          lVar19 = local_a8;
        } while (uVar13 < uVar17);
LAB_00117810:
        lVar18 = local_a0;
        if (uVar17 != 0) {
LAB_00117835:
          p_Var5 = (pHVar15->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          puVar6 = (pHVar15->__vecVisitNode).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = 0;
          do {
            uVar2 = puVar6[uVar13];
            bVar7 = (byte)uVar2 & 0x3f;
            puVar1 = p_Var5 + (uVar2 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            uVar13 = uVar13 + 1;
            lVar18 = local_a0;
          } while (uVar17 != uVar13);
        }
      }
      else {
        lVar19 = lVar19 + 1;
        dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
      }
      lVar18 = lVar18 + 1;
      auVar21._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar21._0_8_ = lVar19;
      auVar21._12_4_ = 0x45300000;
      dVar23 = auVar21._8_8_ - 1.9342813113834067e+25;
      dVar20 = dVar23 + ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
    } while (dVar20 < local_60);
    auVar22._8_4_ = (int)((ulong)lVar18 >> 0x20);
    auVar22._0_8_ = lVar18;
    auVar22._12_4_ = 0x45300000;
    dStack_90 = auVar22._8_8_ - 1.9342813113834067e+25;
    dVar24 = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0);
  }
  uVar2 = pHVar15->__numV;
  local_98 = (HyperGraph *)dVar24;
  local_78._0_8_ = dVar20;
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    local_78._8_4_ = SUB84(dVar23,0);
    local_78._12_4_ = (int)((ulong)dVar23 >> 0x20);
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return ((double)local_78._0_8_ * (double)uVar2) / (double)local_98;
}

Assistant:

double effic_inf_valid_algo(const Nodelist& vecSeed, const double delta = 1e-3, const double eps = 0.01)
    {
        const double c = 2.0 * (exp(1.0) - 2.0);
        const double LambdaL = 1.0 + 2.0 * c * (1.0 + eps) * log(2.0 / delta) / (eps * eps);
        size_t numHyperEdge = 0;
        size_t numCoverd = 0;
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;

        while (numCoverd < LambdaL)
        {
            numHyperEdge++;
            size_t numVisitNode = 0, currIdx = 0;
            const auto uStart = dsfmt_gv_genrand_uint32_range(__numV);
            if (vecBoolSeed[uStart])
            {
                // Stop, this sample is covered
                numCoverd++;
                continue;
            }
            __vecVisitNode[numVisitNode++] = uStart;
            __vecVisitBool[uStart] = true;
            while (currIdx < numVisitNode)
            {
                const auto expand = __vecVisitNode[currIdx++];
                if (_cascadeModel == IC)
                {
                    for (auto& nbr : _graph[expand])
                    {
                        const auto nbrId = nbr.first;
                        if (__vecVisitBool[nbrId])
                            continue;
                        const auto randDouble = dsfmt_gv_genrand_open_close();
                        if (randDouble > nbr.second)
                            continue;
                        if (vecBoolSeed[nbrId])
                        {
                            // Stop, this sample is covered
                            numCoverd++;
                            goto postProcess;
                        }
                        __vecVisitNode[numVisitNode++] = nbrId;
                        __vecVisitBool[nbrId] = true;
                    }
                }
                else if (_cascadeModel == LT)
                {
                    if (_graph[expand].size() == 0)
                        continue;
                    const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                    if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                    const auto nbrId = _graph[expand][nextNbrIdx].first;
                    if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                    if (vecBoolSeed[nbrId])
                    {
                        // Stop, this sample is covered
                        numCoverd++;
                        goto postProcess;
                    }
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                }
            }
            postProcess:
            for (auto i = 0; i < numVisitNode; i++)
                __vecVisitBool[__vecVisitNode[i]] = false;
        }
        return 1.0 * numCoverd * __numV / numHyperEdge;
    }